

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEnvelope.cpp
# Opt level: O1

void __thiscall dsa::CEnvelope::Reset(CEnvelope *this,UINT32 clock,UINT32 rate)

{
  uint uVar1;
  ChannelInfo *pCVar2;
  long lVar3;
  
  this->m_rate = rate;
  this->m_clock = clock;
  this->m_cnt = 0;
  this->m_inc = (int)(0x10000000 / (ulong)clock) * rate;
  uVar1 = this->m_ch;
  if ((ulong)uVar1 != 0) {
    pCVar2 = this->m_ci;
    lVar3 = 0;
    do {
      *(undefined4 *)((long)&pCVar2->value + lVar3) = 0;
      *(undefined8 *)((long)&pCVar2->state + lVar3) = 5;
      lVar3 = lVar3 + 0x20;
    } while ((ulong)uVar1 << 5 != lVar3);
  }
  return;
}

Assistant:

void CEnvelope::Reset(UINT32 clock, UINT32 rate) {
  m_rate = rate;
  m_clock = clock;
  m_cnt = 0;
  m_inc = (MAX_CNT/m_clock) * m_rate;
  for(UINT ch=0; ch<m_ch; ch++) {
    m_ci[ch].value = 0;
    m_ci[ch].speed = 0;
    m_ci[ch].state = FINISH;
  }
}